

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthUdpPort.cpp
# Opt level: O3

void __thiscall SocketInternals::SocketInternals(SocketInternals *this,ostream *ostr)

{
  this->outStr = ostr;
  this->SocketFD = -1;
  this->InterfaceIndex = 0;
  (this->InterfaceName)._M_dataplus._M_p = (pointer)&(this->InterfaceName).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->InterfaceName,"undefined","");
  this->InterfaceMTU = 0x5dc;
  this->FirstRun = true;
  (this->ServerAddr).sin_family = 0;
  (this->ServerAddr).sin_port = 0;
  (this->ServerAddr).sin_addr = 0;
  (this->ServerAddr).sin_zero[0] = '\0';
  (this->ServerAddr).sin_zero[1] = '\0';
  (this->ServerAddr).sin_zero[2] = '\0';
  (this->ServerAddr).sin_zero[3] = '\0';
  (this->ServerAddr).sin_zero[4] = '\0';
  (this->ServerAddr).sin_zero[5] = '\0';
  (this->ServerAddr).sin_zero[6] = '\0';
  (this->ServerAddr).sin_zero[7] = '\0';
  (this->ServerAddrBroadcast).sin_family = 0;
  (this->ServerAddrBroadcast).sin_port = 0;
  (this->ServerAddrBroadcast).sin_addr = 0;
  (this->ServerAddrBroadcast).sin_zero[0] = '\0';
  (this->ServerAddrBroadcast).sin_zero[1] = '\0';
  (this->ServerAddrBroadcast).sin_zero[2] = '\0';
  (this->ServerAddrBroadcast).sin_zero[3] = '\0';
  (this->ServerAddrBroadcast).sin_zero[4] = '\0';
  (this->ServerAddrBroadcast).sin_zero[5] = '\0';
  (this->ServerAddrBroadcast).sin_zero[6] = '\0';
  (this->ServerAddrBroadcast).sin_zero[7] = '\0';
  (this->ServerAddrMulticast).sin_family = 0;
  (this->ServerAddrMulticast).sin_port = 0;
  (this->ServerAddrMulticast).sin_addr = 0;
  (this->ServerAddrMulticast).sin_zero[0] = '\0';
  (this->ServerAddrMulticast).sin_zero[1] = '\0';
  (this->ServerAddrMulticast).sin_zero[2] = '\0';
  (this->ServerAddrMulticast).sin_zero[3] = '\0';
  (this->ServerAddrMulticast).sin_zero[4] = '\0';
  (this->ServerAddrMulticast).sin_zero[5] = '\0';
  (this->ServerAddrMulticast).sin_zero[6] = '\0';
  (this->ServerAddrMulticast).sin_zero[7] = '\0';
  return;
}

Assistant:

SocketInternals::SocketInternals(std::ostream &ostr) : outStr(ostr), SocketFD(INVALID_SOCKET),
                 InterfaceIndex(0), InterfaceName("undefined"), InterfaceMTU(ETH_MTU_DEFAULT), FirstRun(true)
{
    memset(&ServerAddr, 0, sizeof(ServerAddr));
    memset(&ServerAddrBroadcast, 0, sizeof(ServerAddrBroadcast));
    memset(&ServerAddrMulticast, 0, sizeof(ServerAddrMulticast));
}